

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

char * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalParse
          (ModelProto_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  uint32 tag_00;
  bool bVar2;
  string *psVar3;
  uint64 val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar4;
  char cVar5;
  float *local_50;
  InternalMetadata *local_48;
  uint32 tag;
  ExtensionSet *local_38;
  
  local_48 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->_extensions_;
  uVar4 = 0;
  local_50 = (float *)ptr;
LAB_001be7ce:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar2) goto LAB_001be93b;
    local_50 = (float *)google::protobuf::internal::ReadTag((char *)local_50,&tag,0);
    tag_00 = tag;
    if (local_50 == (float *)0x0) goto LAB_001be957;
    uVar1 = tag >> 3;
    cVar5 = (char)tag;
    if (uVar1 == 3) {
      if (cVar5 == '\x18') {
        val = google::protobuf::internal::ReadVarint64((char **)&local_50);
        if (local_50 == (float *)0x0) goto LAB_001be957;
        if ((ModelProto_SentencePiece_Type)val - ModelProto_SentencePiece_Type_NORMAL < 6) {
          _internal_set_type(this,(ModelProto_SentencePiece_Type)val);
        }
        else {
          psVar3 = mutable_unknown_fields_abi_cxx11_(this);
          google::protobuf::internal::WriteVarint(3,val,psVar3);
        }
        goto LAB_001be7ce;
      }
LAB_001be894:
      if (((ulong)tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_001be93b;
      }
      if (tag < 0x640) {
        if (((ulong)local_48->ptr_ & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                      (tag_00,unknown,(char *)local_50,ctx);
      }
      else {
        local_50 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                      (local_38,(ulong)tag,(char *)local_50,
                                       (MessageLite *)_ModelProto_SentencePiece_default_instance_,
                                       local_48,ctx);
      }
    }
    else {
      if (uVar1 == 2) {
        if (cVar5 != '\x15') goto LAB_001be894;
        uVar4 = 2;
        this->score_ = *local_50;
        local_50 = local_50 + 1;
        goto LAB_001be7ce;
      }
      if ((uVar1 != 1) || (cVar5 != '\n')) goto LAB_001be894;
      psVar3 = _internal_mutable_piece_abi_cxx11_(this);
      local_50 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                    (psVar3,(char *)local_50,ctx);
    }
    if (local_50 == (float *)0x0) {
LAB_001be957:
      local_50 = (float *)0x0;
LAB_001be93b:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return (char *)local_50;
    }
  } while( true );
}

Assistant:

const char* ModelProto_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional float score = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 21)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::sentencepiece::ModelProto_SentencePiece_Type_IsValid(val))) {
            _internal_set_type(static_cast<::sentencepiece::ModelProto_SentencePiece_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(3, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}